

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O3

bool __thiscall PatternBlock::isInstructionMatch(PatternBlock *this,ParserWalker *walker)

{
  pointer puVar1;
  uintm uVar2;
  int bytestart;
  ulong uVar3;
  bool bVar4;
  
  if (this->nonzerosize < 1) {
    return this->nonzerosize == 0;
  }
  if ((this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    bVar4 = true;
  }
  else {
    bytestart = this->offset;
    uVar3 = 0;
    do {
      uVar2 = ParserContext::getInstructionBytes
                        (walker->const_context,bytestart,4,walker->point->offset);
      puVar1 = (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      bVar4 = (uVar2 & puVar1[uVar3]) ==
              (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start[uVar3];
      if (!bVar4) {
        return bVar4;
      }
      bytestart = bytestart + 4;
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)(this->maskvec).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2));
  }
  return bVar4;
}

Assistant:

bool PatternBlock::isInstructionMatch(ParserWalker &walker) const

{
  if (nonzerosize<=0) return (nonzerosize==0);
  int4 off = offset;
  for(int4 i=0;i<maskvec.size();++i) {
    uintm data = walker.getInstructionBytes(off,sizeof(uintm));
    if ((maskvec[i] & data)!=valvec[i]) return false;
    off += sizeof(uintm);
  }
  return true;
}